

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTDiagMap.cpp
# Opt level: O2

Diagnostics * __thiscall
slang::ast::ASTDiagMap::coalesce
          (Diagnostics *__return_storage_ptr__,ASTDiagMap *this,SourceManager *sourceManager)

{
  Diagnostic *pDVar1;
  bool bVar2;
  Diagnostic *pDVar3;
  InstanceSymbol *pIVar4;
  DefinitionSymbol *pDVar5;
  table_element_pointer ppVar6;
  Symbol **ppSVar7;
  Scope *pSVar8;
  InstanceSymbol *this_00;
  CheckerInstanceBodySymbol *checkerBody;
  Symbol *pSVar9;
  iterator __begin4;
  Diagnostic *rhs;
  string_view arg;
  Diagnostic *local_d0;
  ulong local_c8;
  iterator __begin2;
  Diagnostic d;
  
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  (__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  __begin2 = boost::unordered::detail::foa::
             table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
             ::begin((table<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_slang::hash<std::tuple<slang::DiagCode,_slang::SourceLocation>,_void>,_std::equal_to<std::tuple<slang::DiagCode,_slang::SourceLocation>_>,_std::allocator<std::pair<const_std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>_>_>
                      *)this);
  ppVar6 = __begin2.p_;
  do {
    if (ppVar6 == (table_element_pointer)0x0) {
      if (sourceManager != (SourceManager *)0x0) {
        Diagnostics::sort(__return_storage_ptr__,sourceManager);
      }
      return __return_storage_ptr__;
    }
    rhs = (ppVar6->second).super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>
          ._M_impl.super__Vector_impl_data._M_start;
    pDVar1 = (ppVar6->second).
             super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if ((ppVar6->first).super__Tuple_impl<0UL,_slang::DiagCode,_slang::SourceLocation>.
        super__Tuple_impl<1UL,_slang::SourceLocation>.
        super__Head_base<1UL,_slang::SourceLocation,_false>._M_head_impl ==
        (SourceLocation)0xffffffffffffffff) {
      for (; rhs != pDVar1; rhs = rhs + 1) {
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic&>
                  ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,rhs);
      }
    }
    else {
      local_c8 = 0;
      local_d0 = (Diagnostic *)0x0;
      this_00 = (InstanceSymbol *)0x0;
LAB_003f76bf:
      if (rhs != pDVar1) {
        if ((local_d0 == (Diagnostic *)0x0) || (bVar2 = Diagnostic::operator==(local_d0,rhs), bVar2)
           ) {
          ppSVar7 = &rhs->symbol;
          do {
            pSVar9 = *ppSVar7;
            do {
              if (pSVar9 == (Symbol *)0x0) {
LAB_003f7786:
                pIVar4 = this_00;
                pDVar3 = local_d0;
LAB_003f7789:
                local_d0 = pDVar3;
                rhs = rhs + 1;
                this_00 = pIVar4;
                goto LAB_003f76bf;
              }
              if (pSVar9->kind == CheckerInstanceBody) {
                pSVar8 = (Scope *)pSVar9[1].originatingSyntax[1].parent;
                if (((ulong)pSVar9[2].name._M_str & 0x10000000000) == 0) {
                  pDVar3 = Diagnostic::addNote(rhs,(DiagCode)0x540008,
                                               *(SourceLocation *)(pSVar9[1].originatingSyntax + 1))
                  ;
                  arg._M_str = "checker";
                  arg._M_len = 7;
                  pDVar3 = Diagnostic::operator<<(pDVar3,arg);
                  Diagnostic::operator<<(pDVar3,*(string_view *)(*(long *)(pSVar9 + 2) + 8));
                }
              }
              else {
                if (pSVar9->kind == InstanceBody) {
                  pIVar4 = (InstanceSymbol *)pSVar9[1].originatingSyntax;
                  local_c8 = local_c8 + 1;
                  pSVar8 = (pIVar4->super_InstanceSymbolBase).super_Symbol.parentScope;
                  if ((pSVar8 == (Scope *)0x0) ||
                     (pDVar3 = rhs, (pSVar8->thisSym->kind | Definition) == CompilationUnit))
                  goto LAB_003f7786;
                  goto LAB_003f7789;
                }
                pSVar8 = pSVar9->parentScope;
              }
              pSVar9 = (Symbol *)0x0;
            } while (pSVar8 == (Scope *)0x0);
            ppSVar7 = &pSVar8->thisSym;
          } while( true );
        }
        goto LAB_003f7810;
      }
      if ((local_d0 == (Diagnostic *)0x0) ||
         (pDVar5 = InstanceSymbol::getDefinition(this_00), pDVar5->instanceCount <= local_c8)) {
LAB_003f7810:
        pDVar3 = (ppVar6->second).
                 super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
                 super__Vector_impl_data._M_start;
        Diagnostic::Diagnostic(&d,pDVar3);
        if (rhs != pDVar1) {
          if (d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_engaged == false) {
            d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
            super__Optional_payload_base<unsigned_long>._M_engaged = true;
          }
          d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
          super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
        }
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                  ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&d);
        while( true ) {
          Diagnostic::~Diagnostic(&d);
          pDVar3 = pDVar3 + 1;
          if (pDVar3 == (ppVar6->second).
                        super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>.
                        _M_impl.super__Vector_impl_data._M_finish) break;
          Diagnostic::Diagnostic(&d,pDVar3);
          bVar2 = Diagnostic::operator==
                            (&d,(__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>).
                                super_SmallVectorBase<slang::Diagnostic>.data_ +
                                ((__return_storage_ptr__->super_SmallVector<slang::Diagnostic,_2UL>)
                                 .super_SmallVectorBase<slang::Diagnostic>.len - 1));
          if (!bVar2) {
            if (rhs != pDVar1) {
              if (d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._M_engaged == false) {
                d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                super__Optional_payload_base<unsigned_long>._M_engaged = true;
              }
              d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
              super__Optional_payload_base<unsigned_long>._M_payload._M_value = 1;
            }
            SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                      ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&d);
          }
        }
      }
      else {
        Diagnostic::Diagnostic(&d,local_d0);
        d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_payload._M_value = local_c8;
        d.coalesceCount.super__Optional_base<unsigned_long,_true,_true>._M_payload.
        super__Optional_payload_base<unsigned_long>._M_engaged = true;
        d.symbol = (Symbol *)this_00;
        SmallVectorBase<slang::Diagnostic>::emplace_back<slang::Diagnostic>
                  ((SmallVectorBase<slang::Diagnostic> *)__return_storage_ptr__,&d);
        Diagnostic::~Diagnostic(&d);
      }
    }
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::tuple<slang::DiagCode,_slang::SourceLocation>,_std::vector<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
    ::increment(&__begin2);
    ppVar6 = __begin2.p_;
  } while( true );
}

Assistant:

Diagnostics ASTDiagMap::coalesce(const SourceManager* sourceManager) {
    Diagnostics results;
    for (auto& [key, diagList] : map) {
        // If the location is NoLocation, just issue each diagnostic.
        if (std::get<1>(key) == SourceLocation::NoLocation) {
            for (auto& diag : diagList)
                results.emplace_back(diag);
            continue;
        }

        // Try to find a diagnostic in an instance that isn't at the top-level
        // (printing such a path seems silly).
        const Diagnostic* found = nullptr;
        const Symbol* inst = nullptr;
        size_t count = 0;
        bool differingArgs = false;

        for (auto& diag : diagList) {
            if (found && *found != diag) {
                differingArgs = true;
                break;
            }

            auto symbol = diag.symbol;
            while (symbol && symbol->kind != SymbolKind::InstanceBody) {
                const Scope* scope;
                if (symbol->kind == SymbolKind::CheckerInstanceBody) {
                    auto& checkerBody = symbol->as<CheckerInstanceBodySymbol>();
                    SLANG_ASSERT(checkerBody.parentInstance);
                    scope = checkerBody.parentInstance->getParentScope();

                    // Add an expansion note to the diagnostic since
                    // we won't have added it yet for the checker.
                    if (!checkerBody.flags.has(InstanceFlags::Uninstantiated)) {
                        diag.addNote(diag::NoteWhileExpanding, checkerBody.parentInstance->location)
                            << "checker"sv << checkerBody.checker.name;
                    }
                }
                else {
                    scope = symbol->getParentScope();
                }

                symbol = scope ? &scope->asSymbol() : nullptr;
            }

            if (!symbol)
                continue;

            auto parent = symbol->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(parent);

            count++;
            if (auto scope = parent->getParentScope()) {
                auto& sym = scope->asSymbol();
                if (sym.kind != SymbolKind::Root && sym.kind != SymbolKind::CompilationUnit) {
                    found = &diag;
                    inst = parent;
                }
            }
        }

        if (!differingArgs && found &&
            inst->as<InstanceSymbol>().getDefinition().getInstanceCount() > count) {
            // The diagnostic is present only in some instances, so include the coalescing
            // information to point the user towards the right ones.
            Diagnostic diag = *found;
            diag.symbol = inst;
            diag.coalesceCount = count;
            results.emplace_back(std::move(diag));
        }
        else {
            // Otherwise no coalescing. If we had differing arguments then set each
            // diagnostic's coalesce count to 1 (as opposed to letting it stay nullopt)
            // so that we get the instance path to it printed automatically.
            auto it = diagList.begin();
            SLANG_ASSERT(it != diagList.end());

            {
                Diagnostic d = *it;
                if (differingArgs)
                    d.coalesceCount = 1;
                results.emplace_back(std::move(d));
            }

            for (++it; it != diagList.end(); ++it) {
                Diagnostic d = *it;
                if (d != results.back()) {
                    if (differingArgs)
                        d.coalesceCount = 1;
                    results.emplace_back(std::move(d));
                }
            }
        }
    }

    if (sourceManager)
        results.sort(*sourceManager);

    return results;
}